

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

void __thiscall FConfigFile::SetValueForKey(FConfigFile *this,char *key,char *value,bool duplicates)

{
  FConfigEntry *this_00;
  FConfigEntry *entry;
  bool duplicates_local;
  char *value_local;
  char *key_local;
  FConfigFile *this_local;
  
  if (this->CurrentSection != (FConfigSection *)0x0) {
    if ((duplicates) ||
       (this_00 = FindEntry(this,this->CurrentSection,key), this_00 == (FConfigEntry *)0x0)) {
      NewConfigEntry(this,this->CurrentSection,key,value);
    }
    else {
      FConfigEntry::SetValue(this_00,value);
    }
  }
  return;
}

Assistant:

void FConfigFile::SetValueForKey (const char *key, const char *value, bool duplicates)
{
	if (CurrentSection != NULL)
	{
		FConfigEntry *entry;

		if (duplicates || (entry = FindEntry (CurrentSection, key)) == NULL)
		{
			NewConfigEntry (CurrentSection, key, value);
		}
		else
		{
			entry->SetValue (value);
		}
	}
}